

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void exp_repeat_pop(lyxp_expr *exp,uint16_t exp_idx)

{
  lyxp_token *plVar1;
  LY_ERR *pLVar2;
  ushort uVar3;
  ulong uVar4;
  undefined6 in_register_00000032;
  
  plVar1 = (&exp->tokens)[CONCAT62(in_register_00000032,exp_idx) & 0xffffffff];
  if (plVar1 != (lyxp_token *)0x0) {
    uVar3 = 0;
    do {
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (*(char *)((long)plVar1 + uVar4 + 1) != '\0');
    *(undefined1 *)((long)plVar1 + uVar4) = 0;
    return;
  }
  pLVar2 = ly_errno_location();
  *pLVar2 = LY_EINT;
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",0x636
        );
  return;
}

Assistant:

static void
exp_repeat_pop(struct lyxp_expr *exp, uint16_t exp_idx)
{
    uint16_t i;

    if (!exp->repeat[exp_idx]) {
        LOGINT;
        return;
    }

    for (i = 0; exp->repeat[exp_idx][i + 1]; ++i);

    exp->repeat[exp_idx][i] = 0;
}